

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

SpikesConsumer * __thiscall
AbstractModuleClient::subscribeSpikeData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ntrodes)

{
  bool bVar1;
  undefined1 uVar2;
  SpikesConsumer *this_00;
  undefined8 in_RSI;
  string *in_RDI;
  HFSubSockSettings sockinfo;
  SpikesConsumer *newsub;
  NTrodeObj *nt;
  iterator __end1;
  iterator __begin1;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> *__range1;
  size_t max_nchans;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  MlmWrap *in_stack_fffffffffffff998;
  SubType in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  SpikesConsumer *foo;
  HighFreqDataType *in_stack_fffffffffffff9b0;
  SubType type;
  HighFreqDataType *in_stack_fffffffffffff9b8;
  HFSubSockSettings *in_stack_fffffffffffff9c0;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffff9c8;
  HighFreqDataType *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f0;
  string *name;
  network_pimpl *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  MlmWrap *in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa64;
  HFParsingInfo *in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa74;
  HighFreqDataType *in_stack_fffffffffffffa78;
  SpikesConsumer *in_stack_fffffffffffffa80;
  HFSubSockSettings *in_stack_fffffffffffffaa0;
  MlmWrap *in_stack_fffffffffffffaa8;
  string *in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffac0;
  MlmWrap *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb60;
  MlmWrap *in_stack_fffffffffffffb68;
  vector<int,_std::allocator<int>_> local_318;
  vector<int,_std::allocator<int>_> local_300;
  reference local_2e8;
  NTrodeObj *local_2e0;
  __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_> local_2d8 [8];
  undefined1 local_298 [24];
  undefined1 *local_280;
  HighFreqDataType *local_278;
  string local_270 [120];
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  allocator local_181;
  string local_180 [183];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  undefined1 local_41 [41];
  undefined8 local_18;
  SpikesConsumer *local_8;
  
  name = (string *)local_41;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"spikestream",(allocator *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Trodes",&local_79);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"spikestream",&local_a1);
    paVar3 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Trodes",paVar3);
    local_8 = (SpikesConsumer *)
              MlmWrap::getHfSubObject
                        (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                         in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"spikestream",&local_181);
    this_01 = (HighFreqDataType *)local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1a9 + 1),"Trodes",(allocator *)this_01);
    network_pimpl::find_hfdt(in_stack_fffffffffffffa28,name,in_RDI);
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    uVar2 = HighFreqDataType::isValid
                      ((HighFreqDataType *)
                       CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    if ((bool)uVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      HighFreqDataType::getDataFormat_abi_cxx11_((HighFreqDataType *)in_stack_fffffffffffff998);
      MlmWrap::createSpikesParsingInfo
                (in_stack_fffffffffffffac8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::__cxx11::string::~string(local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9b0);
      local_278 = (HighFreqDataType *)0x0;
      MlmWrap::getTrodesConfig(in_stack_fffffffffffff998);
      TrodesConfig::getNTrodes((TrodesConfig *)in_stack_fffffffffffff998);
      TrodesConfig::~TrodesConfig
                ((TrodesConfig *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
      local_280 = local_298;
      local_2d8[0]._M_current =
           (NTrodeObj *)
           std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::begin
                     ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff998);
      local_2e0 = (NTrodeObj *)
                  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::end
                            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                             in_stack_fffffffffffff998);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                            *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                           (__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                            *)in_stack_fffffffffffff998);
        if (!bVar1) break;
        local_2e8 = __gnu_cxx::
                    __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                    ::operator*(local_2d8);
        NTrodeObj::getHw_chans((NTrodeObj *)in_stack_fffffffffffff998);
        in_stack_fffffffffffff9b8 =
             (HighFreqDataType *)std::vector<int,_std::allocator<int>_>::size(&local_300);
        in_stack_fffffffffffff9b0 = local_278;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_278);
        if (in_stack_fffffffffffff9b0 < in_stack_fffffffffffff9b8) {
          NTrodeObj::getHw_chans((NTrodeObj *)in_stack_fffffffffffff998);
          local_278 = (HighFreqDataType *)std::vector<int,_std::allocator<int>_>::size(&local_318);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9b0);
        }
        __gnu_cxx::
        __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>::
        operator++(local_2d8);
      }
      local_1f8 = 2;
      std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
                ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9b0);
      type = (SubType)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
      this_00 = (SpikesConsumer *)operator_new(0x420);
      HighFreqDataType::HighFreqDataType
                (this_01,(HighFreqDataType *)CONCAT17(uVar2,in_stack_fffffffffffff9c8));
      HFParsingInfo::HFParsingInfo
                ((HFParsingInfo *)in_stack_fffffffffffff9c0,
                 (HFParsingInfo *)in_stack_fffffffffffff9b8);
      SpikesConsumer::SpikesConsumer
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                 in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
      HFParsingInfo::~HFParsingInfo
                ((HFParsingInfo *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0));
      HighFreqDataType::~HighFreqDataType
                ((HighFreqDataType *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0));
      foo = this_00;
      HighFreqDataType::HighFreqDataType
                (this_01,(HighFreqDataType *)CONCAT17(uVar2,in_stack_fffffffffffff9c8));
      in_stack_fffffffffffff9a0 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
      HFSubSockSettings::HFSubSockSettings
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,type,(hfs_data_callback_fn)foo,
                 (void *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0));
      HighFreqDataType::~HighFreqDataType
                ((HighFreqDataType *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0));
      MlmWrap::addSubToList
                ((MlmWrap *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0),
                 (HighFreqSub *)in_stack_fffffffffffff998);
      HFSubSockSettings::HFSubSockSettings
                ((HFSubSockSettings *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0),
                 (HFSubSockSettings *)in_stack_fffffffffffff998);
      MlmWrap::addHfTypeToSubbedList(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1bf82d);
      local_1f8 = 1;
      local_8 = this_00;
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1bf855);
      HFParsingInfo::~HFParsingInfo
                ((HFParsingInfo *)CONCAT44((undefined4)local_18,in_stack_fffffffffffff9a0));
      in_stack_fffffffffffff9a4 = (undefined4)local_18;
    }
    else {
      paVar3 = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f0,"Spikes data could not be found on the network!",paVar3);
      MlmWrap::error(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
      std::operator<<((ostream *)&std::cerr,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      local_8 = (SpikesConsumer *)0x0;
      local_1f8 = 1;
    }
    HighFreqDataType::~HighFreqDataType
              ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  }
  return local_8;
}

Assistant:

SpikesConsumer* AbstractModuleClient::subscribeSpikeData(size_t buffersize, std::vector<std::string> ntrodes){
    if(isHfTypeCurrentlySubbed(hfType_SPIKE, TRODES_NETWORK_ID)){
        return (SpikesConsumer*)getHfSubObject(hfType_SPIKE, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_SPIKE, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Spikes data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createSpikesParsingInfo(ntrodes, dt.getDataFormat());
    size_t max_nchans = 0;
    for(auto const& nt : getTrodesConfig().getNTrodes()){
        if(nt.getHw_chans().size() > max_nchans){
            max_nchans = nt.getHw_chans().size();
        }
    }
    SpikesConsumer* newsub = new SpikesConsumer(dt, buffersize, parseinfo, max_nchans*POINTS_IN_WAVE);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}